

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

iuIParamGenerator<bool> * __thiscall
iutest::detail::iuValueArray::operator_cast_to_iuIParamGenerator_(iuValueArray *this)

{
  iuValuesInParamsGenerator<std::__cxx11::string> *this_00;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ar;
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  mStack_58;
  
  iuValueArray<const_char_*,_const_char_*>::
  make_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  make_array(&mStack_58,(_MyTuple *)this);
  this_00 = (iuValuesInParamsGenerator<std::__cxx11::string> *)operator_new(0x28);
  iuValuesInParamsGenerator<std::__cxx11::string>::
  iuValuesInParamsGenerator<std::__cxx11::string,2ul>(this_00,mStack_58.val);
  lVar1 = -0x40;
  paVar2 = &mStack_58.val[1].field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -4);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return (iuIParamGenerator<bool> *)this_00;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        make_array<T> ar(v);
#if !defined(IUTEST_NO_FUNCTION_TEMPLATE_ORDERING)
        return new iuValuesInParamsGenerator<T>(ar.val);
#else
        return new iuValuesInParamsGenerator<T>(ar.val, ar.val + IUTEST_PP_COUNTOF(ar.val));
#endif
    }